

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_portable_deserialize_safe(char *buf,size_t maxbytes)

{
  _Bool _Var1;
  roaring_bitmap_t *prStack_30;
  _Bool is_ok;
  size_t bytesread;
  roaring_bitmap_t *ans;
  size_t maxbytes_local;
  char *buf_local;
  
  ans = (roaring_bitmap_t *)maxbytes;
  maxbytes_local = (size_t)buf;
  bytesread = (size_t)malloc(0x28);
  if ((roaring_array_t *)bytesread == (roaring_array_t *)0x0) {
    buf_local = (char *)0x0;
  }
  else {
    _Var1 = ra_portable_deserialize
                      ((roaring_array_t *)bytesread,(char *)maxbytes_local,(size_t)ans,
                       (size_t *)&stack0xffffffffffffffd0);
    if ((_Var1) && (ans < prStack_30)) {
      __assert_fail("bytesread <= maxbytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x3fdd,
                    "roaring_bitmap_t *roaring_bitmap_portable_deserialize_safe(const char *, size_t)"
                   );
    }
    roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)bytesread,false);
    if (_Var1) {
      buf_local = (char *)bytesread;
    }
    else {
      free((void *)bytesread);
      buf_local = (char *)0x0;
    }
  }
  return (roaring_bitmap_t *)buf_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_portable_deserialize_safe(const char *buf, size_t maxbytes) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)malloc(sizeof(roaring_bitmap_t));
    if (ans == NULL) {
        return NULL;
    }
    size_t bytesread;
    bool is_ok = ra_portable_deserialize(&ans->high_low_container, buf, maxbytes, &bytesread);
    if(is_ok) assert(bytesread <= maxbytes);
    roaring_bitmap_set_copy_on_write(ans, false);
    if (!is_ok) {
        free(ans);
        return NULL;
    }
    return ans;
}